

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O2

OutputFile * __thiscall re2c::OutputFile::wind(OutputFile *this,uint32_t ind)

{
  OutputFragment *pOVar1;
  uint32_t in_EDX;
  undefined4 in_register_00000034;
  string sStack_38;
  
  pOVar1 = ((this->blocks).
            super__Vector_base<re2c::OutputBlock_*,_std::allocator<re2c::OutputBlock_*>_>._M_impl.
            super__Vector_impl_data._M_finish[-1]->fragments).
           super__Vector_base<re2c::OutputFragment_*,_std::allocator<re2c::OutputFragment_*>_>.
           _M_impl.super__Vector_impl_data._M_finish[-1];
  indent_abi_cxx11_(&sStack_38,(re2c *)CONCAT44(in_register_00000034,ind),in_EDX);
  std::operator<<((ostream *)&pOVar1->stream,(string *)&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return this;
}

Assistant:

OutputFile & OutputFile::wind (uint32_t ind)
{
	stream () << indent(ind);
	return *this;
}